

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O2

uint mraa_get_platform_adc_supported_bits(int platform_offset)

{
  _board_t *p_Var1;
  uint uVar2;
  
  if (platform_offset == 0) {
    uVar2 = 0;
    if ((plat != (mraa_board_t *)0x0) && (uVar2 = 0, plat->aio_count != 0)) {
      uVar2 = plat->adc_supported;
    }
    return uVar2;
  }
  uVar2 = 0;
  if (((plat != (mraa_board_t *)0x0) &&
      (p_Var1 = plat->sub_platform, uVar2 = 0, p_Var1 != (_board_t *)0x0)) &&
     (p_Var1->aio_count != 0)) {
    uVar2 = p_Var1->adc_supported;
  }
  return uVar2;
}

Assistant:

unsigned int
mraa_get_platform_adc_supported_bits(int platform_offset)
{
    if (platform_offset == MRAA_MAIN_PLATFORM_OFFSET)
        return mraa_adc_supported_bits();
    else {
        if (!mraa_has_sub_platform())
            return 0;

        if (plat->sub_platform->aio_count == 0)
            return 0;

        return plat->sub_platform->adc_supported;
    }
}